

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O0

int Aig_ManCountReprs(Aig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_28 = 0;
  if (p->pReprs == (Aig_Obj_t **)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
      pvVar2 = Vec_PtrEntry(p->vObjs,local_24);
      if (pvVar2 != (void *)0x0) {
        local_28 = (uint)(p->pReprs[local_24] != (Aig_Obj_t *)0x0) + local_28;
      }
    }
    p_local._4_4_ = local_28;
  }
  return p_local._4_4_;
}

Assistant:

int Aig_ManCountReprs( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    if ( p->pReprs == NULL )
        return 0;
    Aig_ManForEachObj( p, pObj, i )
        Counter += (p->pReprs[i] != NULL);
    return Counter;
}